

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileio.c
# Opt level: O0

int prvTidyinitStdIOFileSource(TidyAllocator *allocator,TidyInputSource *inp,FILE *fp)

{
  undefined8 *__s;
  FileSource *fin;
  FILE *fp_local;
  TidyInputSource *inp_local;
  TidyAllocator *allocator_local;
  
  __s = (undefined8 *)(*allocator->vtbl->alloc)(allocator,0x28);
  if (__s == (undefined8 *)0x0) {
    allocator_local._4_4_ = -1;
  }
  else {
    memset(__s,0,0x28);
    __s[1] = allocator;
    *__s = fp;
    inp->getByte = filesrc_getByte;
    inp->eof = filesrc_eof;
    inp->ungetByte = filesrc_ungetByte;
    inp->sourceData = __s;
    allocator_local._4_4_ = 0;
  }
  return allocator_local._4_4_;
}

Assistant:

int TY_(initFileSource)( TidyAllocator *allocator, TidyInputSource* inp, FILE* fp )
{
  FileSource* fin = NULL;

  fin = (FileSource*) TidyAlloc( allocator, sizeof(FileSource) );
  if ( !fin )
      return -1;
  TidyClearMemory( fin, sizeof(FileSource) );
  fin->unget.allocator = allocator;
  fin->fp = fp;

  inp->getByte    = filesrc_getByte;
  inp->eof        = filesrc_eof;
  inp->ungetByte  = filesrc_ungetByte;
  inp->sourceData = fin;

  return 0;
}